

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O1

size_t __thiscall
adios2::format::BP5Deserializer::WriterCohortSize(BP5Deserializer *this,size_t Step)

{
  pointer puVar1;
  pointer puVar2;
  size_t *psVar3;
  
  if (this->m_RandomAccessMode == true) {
    puVar1 = (this->m_WriterCohortSize).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->m_WriterCohortSize).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (Step < (ulong)((long)puVar2 - (long)puVar1 >> 3)) {
      psVar3 = puVar1 + Step;
    }
    else {
      psVar3 = puVar2 + -1;
    }
  }
  else {
    psVar3 = &this->m_CurrentWriterCohortSize;
  }
  return *psVar3;
}

Assistant:

size_t BP5Deserializer::WriterCohortSize(size_t Step) const
{
    if (m_RandomAccessMode)
    {
        if (Step < m_WriterCohortSize.size())
        {
            return m_WriterCohortSize[Step];
        }
        else
        {
            return m_WriterCohortSize.back();
        }
    }
    else
    {
        return m_CurrentWriterCohortSize;
    }
}